

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * util::text_word_wrap(string *__return_storage_ptr__,string *string,int width)

{
  ulong uVar1;
  char *pcVar2;
  byte *pbVar3;
  ulong local_30;
  size_t i;
  int local_20;
  int length;
  int width_local;
  string *string_local;
  string *result;
  
  local_20 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)string);
  for (local_30 = 0; uVar1 = std::__cxx11::string::length(), local_30 < uVar1;
      local_30 = local_30 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar2 == ' ') {
      local_20 = 0;
    }
    else {
      pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      local_20 = *(int *)(sizes + (long)(int)(uint)*pbVar3 * 4) + local_20;
      if (width < local_20) {
        std::__cxx11::string::insert((ulong)__return_storage_ptr__,(char *)(local_30 - 1));
        local_20 = 0;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string text_word_wrap(const std::string& string, int width)
{
	int length = 0;
	std::string result(string);

	for (std::size_t i = 0; i < result.length(); ++i)
	{
		if (result[i] == ' ')
		{
			length = 0;
		}
		else
		{
			length += sizes[result[i] & 0xFF];

			if (length > width)
			{
				result.insert(i - 1, " ");
				length = 0;
			}
		}
	}

	return result;
}